

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall
adios2::query::Worker::GetResultCoverage
          (Worker *this,Box<adios2::Dims> *outputRegion,
          vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *touchedBlocks)

{
  QueryBase *pQVar1;
  size_type sVar2;
  bool bVar3;
  _Alloc_hider cpy;
  vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> blockHits;
  BlockHit blk;
  string local_b8;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  string local_50;
  
  std::
  vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::_M_erase_at_end(touchedBlocks,
                    (touchedBlocks->
                    super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  bVar3 = QueryBase::UseOutputRegion(this->m_Query,outputRegion);
  if (!bVar3) {
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"Toolkit","");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"query::Worker","");
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"GetResultCoverage","");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"Unable to use the output region","");
    helper::Throw<std::invalid_argument>((string *)local_90,&local_b8,&local_50,&local_70,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_);
    }
  }
  pQVar1 = this->m_Query;
  if ((pQVar1 != (QueryBase *)0x0) && (this->m_SourceReader != (Engine *)0x0)) {
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    (*pQVar1->_vptr_QueryBase[4])(pQVar1,this->m_SourceReader->m_IO);
    sVar2 = local_b8._M_string_length;
    if (local_b8._M_dataplus._M_p != (pointer)local_b8._M_string_length) {
      cpy._M_p = local_b8._M_dataplus._M_p;
      do {
        BlockHit::BlockHit((BlockHit *)local_90,(BlockHit *)cpy._M_p);
        std::
        vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
        ::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>*,std::vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                  ((vector<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                    *)touchedBlocks,
                   (touchedBlocks->
                   super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,local_90._8_8_,
                   local_80._M_allocated_capacity);
        std::
        vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ::~vector((vector<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   *)(local_90 + 8));
        cpy._M_p = cpy._M_p + 0x20;
      } while (cpy._M_p != (pointer)sVar2);
    }
    std::vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_>::~vector
              ((vector<adios2::query::BlockHit,_std::allocator<adios2::query::BlockHit>_> *)
               &local_b8);
  }
  return;
}

Assistant:

void Worker::GetResultCoverage(const adios2::Box<adios2::Dims> &outputRegion,
                               std::vector<Box<Dims>> &touchedBlocks)
{
    touchedBlocks.clear();

    if (!m_Query->UseOutputRegion(outputRegion))
    {
        helper::Throw<std::invalid_argument>("Toolkit", "query::Worker", "GetResultCoverage",
                                             "Unable to use the output region");
    }

    if (m_Query && m_SourceReader)
    {
        std::vector<BlockHit> blockHits;
        m_Query->BlockIndexEvaluate(m_SourceReader->m_IO, *m_SourceReader, blockHits);

        for (auto blk : blockHits)
            touchedBlocks.insert(touchedBlocks.end(), blk.m_Regions.begin(), blk.m_Regions.end());
    }
}